

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O0

void yelp(monst *mtmp)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_18;
  char *yelp_verb;
  monst *mtmp_local;
  
  local_18 = (char *)0x0;
  if ((((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0) &&
      ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0)) && (mtmp->data->msound != '\0')) {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      switch(mtmp->data->msound) {
      case '\x01':
      case '\x04':
        local_18 = "yelp";
        break;
      case '\x02':
        local_18 = "yowl";
        break;
      case '\x03':
        local_18 = "snarl";
        break;
      case '\x05':
        local_18 = "squeal";
        break;
      case '\x06':
        local_18 = "screak";
        break;
      case '\v':
        local_18 = "wail";
      }
    }
    else {
      iVar2 = rn2(0x24);
      local_18 = h_sounds[iVar2];
    }
    if (local_18 != (char *)0x0) {
      pcVar3 = Monnam(mtmp);
      pcVar4 = vtense((char *)0x0,local_18);
      pline("%s %s!",pcVar3,pcVar4);
      if (flags.run != 0) {
        nomul(0,(char *)0x0);
      }
      wake_nearto((int)mtmp->mx,(int)mtmp->my,mtmp->data->mlevel * 0xc);
    }
  }
  return;
}

Assistant:

void yelp(struct monst *mtmp)
{
    const char *yelp_verb = 0;

    if (mtmp->msleeping || !mtmp->mcanmove || !mtmp->data->msound)
	return;

    /* presumably nearness and soundok checks have already been made */
    if (Hallucination)
	yelp_verb = h_sounds[rn2(SIZE(h_sounds))];
    else switch (mtmp->data->msound) {
	case MS_MEW:
	    yelp_verb = "yowl";
	    break;
	case MS_BARK:
	case MS_GROWL:
	    yelp_verb = "yelp";
	    break;
	case MS_ROAR:
	    yelp_verb = "snarl";
	    break;
	case MS_SQEEK:
	    yelp_verb = "squeal";
	    break;
	case MS_SQAWK:
	    yelp_verb = "screak";
	    break;
	case MS_WAIL:
	    yelp_verb = "wail";
	    break;
    }
    if (yelp_verb) {
	pline("%s %s!", Monnam(mtmp), vtense(NULL, yelp_verb));
	if (flags.run) nomul(0, NULL);
	wake_nearto(mtmp->mx, mtmp->my, mtmp->data->mlevel * 12);
    }
}